

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O3

void __thiscall
google::protobuf::io::FileOutputStream::CopyingFileOutputStream::~CopyingFileOutputStream
          (CopyingFileOutputStream *this)

{
  bool bVar1;
  LogMessage *pLVar2;
  char *value;
  LogFinisher local_49;
  LogMessage local_48;
  
  (this->super_CopyingOutputStream)._vptr_CopyingOutputStream =
       (_func_int **)&PTR__CopyingFileOutputStream_004d4208;
  if (this->close_on_delete_ == true) {
    bVar1 = Close(this);
    if (!bVar1) {
      internal::LogMessage::LogMessage
                (&local_48,LOGLEVEL_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl.cc"
                 ,0xc2);
      pLVar2 = internal::LogMessage::operator<<(&local_48,"close() failed: ");
      value = strerror(this->errno_);
      pLVar2 = internal::LogMessage::operator<<(pLVar2,value);
      internal::LogFinisher::operator=(&local_49,pLVar2);
      internal::LogMessage::~LogMessage(&local_48);
    }
  }
  return;
}

Assistant:

FileOutputStream::CopyingFileOutputStream::~CopyingFileOutputStream() {
  if (close_on_delete_) {
    if (!Close()) {
      GOOGLE_LOG(ERROR) << "close() failed: " << strerror(errno_);
    }
  }
}